

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBTensorOp.cpp
# Opt level: O1

void __thiscall
amrex::MLEBTensorOp::apply
          (MLEBTensorOp *this,int amrlev,int mglev,MultiFab *out,MultiFab *in,BCMode bc_mode,
          StateMode s_mode,MLMGBndry *bndry)

{
  FabArray<amrex::FArrayBox> *this_00;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  undefined8 uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  pointer pVVar8;
  FabArray<amrex::FArrayBox> *this_01;
  _Head_base<0UL,_amrex::MultiFab_*,_false> _Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  FabType FVar19;
  uint uVar20;
  long lVar21;
  FabArray<amrex::EBCellFlagFab> *pFVar22;
  FabArray<amrex::FArrayBox> *this_02;
  int *piVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  int iVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  int iVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  bool bVar53;
  ulong uVar54;
  ulong uVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  undefined1 auVar68 [16];
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  double dVar81;
  double local_7c0;
  double local_7b0;
  double local_7a0;
  double local_790;
  double local_778;
  double dStack_760;
  double local_758;
  double dStack_750;
  double local_738;
  double dStack_730;
  undefined1 local_728 [48];
  double local_6f8;
  double dStack_6f0;
  double local_6e8;
  double dStack_6e0;
  Array4<const_int> local_6b8;
  double local_678;
  double dStack_670;
  double local_668;
  undefined8 uStack_660;
  Array4<double> axfab;
  Box local_5d4;
  double local_5b8;
  double dStack_5b0;
  Array4<const_double> local_5a8;
  Array4<const_double> local_568;
  Array4<const_double> local_528;
  undefined4 local_4e8;
  undefined4 uStack_4e4;
  undefined8 uStack_4e0;
  long local_4d0;
  MultiCutFab *local_4c8;
  FabArray<amrex::FArrayBox> *local_4c0;
  FabArray<amrex::FArrayBox> *local_4b8;
  FabArray<amrex::FArrayBox> *local_4b0;
  FabArray<amrex::EBCellFlagFab> *local_4a8;
  FabArray<amrex::FArrayBox> *local_4a0;
  Array4<const_double> fzfab;
  Array4<const_double> fyfab;
  Array4<const_double> fxfab;
  MultiCutFab *local_3c8;
  MultiCutFab *pMStack_3c0;
  MultiCutFab *local_3b8;
  MultiCutFab *local_3a8;
  MultiCutFab *pMStack_3a0;
  MultiCutFab *local_398;
  Real dzi;
  Real dyi;
  Array4<const_double> local_348;
  Array4<const_double> local_308;
  Array4<const_double> local_2c8;
  Array4<const_double> local_288;
  Real dxi;
  undefined8 uStack_240;
  undefined1 local_238 [16];
  Array4<const_double> local_228;
  Array4<const_double> local_1e8;
  Array4<const_double> local_1a8;
  Array4<const_amrex::EBCellFlag> local_168;
  Array4<const_double> local_128;
  Array4<const_double> local_e8;
  MFIter mfi;
  MFItInfo mfi_info;
  
  local_4a0 = &out->super_FabArray<amrex::FArrayBox>;
  MLEBABecLap::apply(&this->super_MLEBABecLap,amrlev,mglev,out,in,bc_mode,s_mode,bndry);
  lVar31 = (long)mglev;
  lVar24 = (long)amrlev;
  pVVar8 = (this->m_kappa).
           super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
           .
           super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar21 = ((long)*(pointer *)
                   ((long)&pVVar8[lVar24].
                           super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                           .
                           super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                   + 8) -
            *(long *)&pVVar8[lVar24].
                      super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                      .
                      super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
           >> 7) * -0x71c71c71c71c71c7;
  if (lVar21 - lVar31 != 0 && lVar31 <= lVar21) {
    local_4d0 = lVar24;
    local_4b8 = &in->super_FabArray<amrex::FArrayBox>;
    applyBCTensor(this,amrlev,mglev,in,bc_mode,s_mode,bndry);
    lVar21 = *(long *)(*(long *)&(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.
                                 super_MLLinOp.m_factory.
                                 super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar24].
                                 super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                                 .
                                 super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                      + lVar31 * 8);
    if (lVar21 == 0) {
      lVar21 = 0;
    }
    else {
      lVar21 = __dynamic_cast(lVar21,&FabFactory<amrex::FArrayBox>::typeinfo,
                              &EBFArrayBoxFactory::typeinfo,0);
    }
    if (lVar21 == 0) {
      local_4a8 = (FabArray<amrex::EBCellFlagFab> *)0x0;
      local_4c0 = (FabArray<amrex::FArrayBox> *)0x0;
      local_3a8 = (MultiCutFab *)0x0;
      pMStack_3a0 = (MultiCutFab *)0x0;
      local_398 = (MultiCutFab *)0x0;
      local_3c8 = (MultiCutFab *)0x0;
      pMStack_3c0 = (MultiCutFab *)0x0;
      local_3b8 = (MultiCutFab *)0x0;
      local_4c8 = (MultiCutFab *)0x0;
    }
    else {
      pFVar22 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar21 + 0xd8));
      local_4c0 = &EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar21 + 0xd8))->
                   super_FabArray<amrex::FArrayBox>;
      EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar21 + 0xd8));
      EBDataCollection::getFaceCent(*(EBDataCollection **)(lVar21 + 0xd8));
      local_4a8 = pFVar22;
      local_4c8 = EBDataCollection::getBndryCent(*(EBDataCollection **)(lVar21 + 0xd8));
    }
    lVar21 = *(long *)&(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp
                       .m_geom.
                       super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_4d0].
                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
    lVar24 = lVar31 * 200;
    uVar4 = *(undefined8 *)(lVar21 + 0x38 + lVar24);
    local_4e8 = (undefined4)uVar4;
    uStack_4e4 = (undefined4)((ulong)uVar4 >> 0x20);
    uStack_4e0 = 0;
    dVar5 = *(double *)(lVar21 + 0x40 + lVar24);
    dVar6 = *(double *)(lVar21 + 0x48 + lVar24);
    local_4b0 = (FabArray<amrex::FArrayBox> *)
                (lVar31 * 0x480 +
                *(long *)&(this->m_tauflux).
                          super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_4d0].
                          super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                          .
                          super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                );
    lVar21 = *(long *)&(this->super_MLEBABecLap).m_cc_mask.
                       super_vector<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_4d0].
                       super_vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>.
                       super__Vector_base<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>;
    this_01 = *(FabArray<amrex::FArrayBox> **)
               (*(long *)&(this->super_MLEBABecLap).m_eb_b_coeffs.
                          super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_4d0].
                          super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                          .
                          super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               + lVar31 * 8);
    lVar24 = *(long *)&(this->m_eb_kappa).
                       super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_4d0].
                       super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                       super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>;
    dVar7 = (this->super_MLEBABecLap).m_b_scalar;
    compCrossTerms(this,amrlev,mglev,(MultiFab *)local_4b8);
    mfi_info.num_streams = Gpu::Device::max_gpu_streams;
    mfi_info.do_tiling = true;
    mfi_info.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
    mfi_info.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
    mfi_info.tilesize.vect[2] = DAT_00753ec0;
    mfi_info.dynamic = true;
    mfi_info.device_sync = true;
    MFIter::MFIter(&mfi,&local_4a0->super_FabArrayBase,&mfi_info);
    if (mfi.currentIndex < mfi.endIndex) {
      this_00 = local_4b0 + 1;
      this_02 = local_4b0 + 2;
      dxi = (double)CONCAT44(uStack_4e4,local_4e8) * dVar7;
      uStack_240 = uStack_4e0;
      dVar59 = dVar5 * dVar7;
      dVar60 = dVar6 * dVar7;
      local_238._8_4_ = local_4e8;
      local_238._0_8_ = CONCAT44(uStack_4e4,local_4e8);
      local_238._12_4_ = uStack_4e4;
      pFVar22 = local_4a8;
      do {
        auVar10 = local_728._0_16_;
        MFIter::tilebox(&local_5d4,&mfi);
        FVar19 = regular;
        if (pFVar22 != (FabArray<amrex::EBCellFlagFab> *)0x0) {
          piVar23 = &mfi.currentIndex;
          if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar23 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + mfi.currentIndex;
          }
          FVar19 = EBCellFlagFab::getType
                             ((pFVar22->m_fabs_v).
                              super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[*piVar23],&local_5d4);
        }
        if (FVar19 != covered) {
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&axfab,local_4a0,&mfi);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&fxfab,local_4b0,&mfi);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&fyfab,this_00,&mfi);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&fzfab,this_02,&mfi);
          if (FVar19 == regular) {
            local_728._4_4_ = 0;
            local_728._0_4_ = local_5d4.smallend.vect[2];
            local_728._8_8_ = auVar10._8_8_;
            pFVar22 = local_4a8;
            if (local_5d4.smallend.vect[2] <= local_5d4.bigend.vect[2]) {
              lVar32 = (long)local_5d4.smallend.vect[1];
              lVar25 = (long)local_5d4.smallend.vect[0] * 8;
              uVar13 = local_5d4.smallend.vect[2];
              do {
                auVar10 = local_728._0_16_;
                uVar13 = uVar13 + 1;
                uVar79 = local_728._0_4_;
                if (local_5d4.smallend.vect[1] <= local_5d4.bigend.vect[1]) {
                  lVar34 = (long)(int)local_728._0_4_;
                  lVar27 = (long)fzfab.begin.x;
                  lVar28 = (long)axfab.begin.x;
                  lVar42 = axfab.jstride * 8;
                  lVar26 = (lVar32 - axfab.begin.y) * lVar42 +
                           (lVar34 - axfab.begin.z) * axfab.kstride * 8;
                  local_758 = (double)((long)axfab.p + lVar26 + lVar28 * -8 + lVar25);
                  local_6e8 = (double)((long)axfab.p +
                                      lVar26 + axfab.nstride * 8 + lVar28 * -8 + lVar25);
                  local_678 = (double)((long)axfab.p +
                                      axfab.nstride * 0x10 + lVar26 + lVar28 * -8 + lVar25);
                  lVar50 = fzfab.jstride * 8;
                  lVar26 = (lVar32 - fzfab.begin.y) * lVar50;
                  lVar28 = (lVar34 - fzfab.begin.z) * fzfab.kstride * 8 + lVar26;
                  lVar26 = (long)(int)(uVar13 - fzfab.begin.z) * fzfab.kstride * 8 + lVar26;
                  lVar40 = (long)fzfab.p + lVar28 + fzfab.nstride * 0x10 + lVar27 * -8 + lVar25;
                  lVar29 = (long)fzfab.p + lVar28 + fzfab.nstride * 8 + lVar27 * -8 + lVar25;
                  lVar45 = (long)fzfab.p + lVar28 + lVar27 * -8 + lVar25;
                  local_5b8 = (double)((long)fzfab.p +
                                      fzfab.nstride * 0x10 + lVar26 + lVar27 * -8 + lVar25);
                  lVar44 = (long)fzfab.p + lVar26 + fzfab.nstride * 8 + lVar27 * -8 + lVar25;
                  lVar46 = (long)fzfab.p + lVar26 + lVar27 * -8 + lVar25;
                  iVar36 = (local_5d4.smallend.vect[1] + 1) - fyfab.begin.y;
                  lVar27 = (lVar34 - fyfab.begin.z) * fyfab.kstride;
                  lVar35 = (long)fyfab.begin.x;
                  lVar51 = fyfab.jstride * 8;
                  lVar26 = (lVar32 - fyfab.begin.y) * lVar51 + lVar27 * 8;
                  lVar47 = (long)fyfab.p + lVar26 + lVar35 * -8 + lVar25;
                  lVar48 = (long)fyfab.p + lVar26 + fyfab.nstride * 8 + lVar35 * -8 + lVar25;
                  lVar43 = (long)fyfab.p + fyfab.nstride * 0x10 + lVar26 + lVar35 * -8 + lVar25;
                  lVar28 = fxfab.jstride * 8;
                  lVar26 = (lVar32 - fxfab.begin.y) * lVar28 +
                           (lVar34 - fxfab.begin.z) * fxfab.kstride * 8;
                  lVar34 = (long)fxfab.begin.x;
                  lVar52 = (long)fxfab.p + lVar26 + lVar34 * -8 + lVar25 + 8;
                  lVar39 = (long)fxfab.p + lVar26 + fxfab.nstride * 8 + lVar34 * -8 + lVar25 + 8;
                  lVar34 = (long)fxfab.p + fxfab.nstride * 0x10 + lVar26 + lVar34 * -8 + lVar25 + 8;
                  lVar26 = lVar32;
                  do {
                    if (local_5d4.smallend.vect[0] <= local_5d4.bigend.vect[0]) {
                      lVar33 = iVar36 * lVar51;
                      local_668 = (double)((long)fyfab.p +
                                          lVar33 + fyfab.nstride * 8 + lVar27 * 8 + lVar35 * -8 +
                                                   lVar25);
                      lVar38 = 0;
                      do {
                        *(double *)((long)local_758 + lVar38 * 8) =
                             (*(double *)(lVar46 + lVar38 * 8) - *(double *)(lVar45 + lVar38 * 8)) *
                             dVar60 + (*(double *)(lVar52 + lVar38 * 8) -
                                      *(double *)(lVar52 + -8 + lVar38 * 8)) * dxi +
                                      (*(double *)
                                        ((long)fyfab.p +
                                        lVar38 * 8 + lVar33 + lVar27 * 8 + lVar35 * -8 + lVar25) -
                                      *(double *)(lVar47 + lVar38 * 8)) * dVar59 +
                             *(double *)((long)local_758 + lVar38 * 8);
                        *(double *)((long)local_6e8 + lVar38 * 8) =
                             (*(double *)(lVar44 + lVar38 * 8) - *(double *)(lVar29 + lVar38 * 8)) *
                             dVar60 + (*(double *)(lVar39 + lVar38 * 8) -
                                      *(double *)(lVar39 + -8 + lVar38 * 8)) * dxi +
                                      (*(double *)((long)local_668 + lVar38 * 8) -
                                      *(double *)(lVar48 + lVar38 * 8)) * dVar59 +
                             *(double *)((long)local_6e8 + lVar38 * 8);
                        *(double *)((long)local_678 + lVar38 * 8) =
                             (*(double *)((long)local_5b8 + lVar38 * 8) -
                             *(double *)(lVar40 + lVar38 * 8)) * dVar60 +
                             (*(double *)(lVar34 + lVar38 * 8) -
                             *(double *)(lVar34 + -8 + lVar38 * 8)) * dxi +
                             (*(double *)
                               ((long)fyfab.p +
                               lVar38 * 8 +
                               lVar33 + lVar27 * 8 + fyfab.nstride * 0x10 + lVar35 * -8 + lVar25) -
                             *(double *)(lVar43 + lVar38 * 8)) * dVar59 +
                             *(double *)((long)local_678 + lVar38 * 8);
                        lVar38 = lVar38 + 1;
                      } while ((local_5d4.bigend.vect[0] - local_5d4.smallend.vect[0]) + 1 !=
                               (int)lVar38);
                    }
                    lVar26 = lVar26 + 1;
                    local_758 = (double)((long)local_758 + lVar42);
                    local_6e8 = (double)((long)local_6e8 + lVar42);
                    local_678 = (double)((long)local_678 + lVar42);
                    lVar40 = lVar40 + lVar50;
                    lVar29 = lVar29 + lVar50;
                    lVar45 = lVar45 + lVar50;
                    local_5b8 = (double)((long)local_5b8 + lVar50);
                    lVar44 = lVar44 + lVar50;
                    lVar46 = lVar46 + lVar50;
                    iVar36 = iVar36 + 1;
                    lVar47 = lVar47 + lVar51;
                    lVar48 = lVar48 + lVar51;
                    lVar43 = lVar43 + lVar51;
                    lVar52 = lVar52 + lVar28;
                    lVar39 = lVar39 + lVar28;
                    lVar34 = lVar34 + lVar28;
                  } while (local_5d4.bigend.vect[1] + 1 != (int)lVar26);
                }
                local_728._4_4_ = 0;
                local_728._0_4_ = local_728._0_4_ + 1;
                local_728._8_8_ = auVar10._8_8_;
              } while (uVar79 != local_5d4.bigend.vect[2]);
            }
          }
          else {
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_1e8,local_4b8,&mfi);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_e8,this_01,&mfi);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_128,(FabArray<amrex::FArrayBox> *)(lVar31 * 0x180 + lVar24),&mfi);
            FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                      (&local_6b8,(FabArray<amrex::IArrayBox> *)(lVar21 + lVar31 * 0x180),&mfi);
            FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                      (&local_168,pFVar22,&mfi);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_1a8,local_4c0,&mfi);
            MultiCutFab::const_array(&local_528,local_3a8,&mfi);
            MultiCutFab::const_array(&local_568,pMStack_3a0,&mfi);
            MultiCutFab::const_array(&local_5a8,local_398,&mfi);
            MultiCutFab::const_array(&local_2c8,local_3c8,&mfi);
            MultiCutFab::const_array(&local_308,pMStack_3c0,&mfi);
            MultiCutFab::const_array(&local_348,local_3b8,&mfi);
            MultiCutFab::const_array(&local_228,local_4c8,&mfi);
            _Var9._M_head_impl =
                 *(MultiFab **)
                  &(((this->super_MLEBABecLap).m_eb_phi.
                     super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
            iVar36 = (this->super_MLEBABecLap).m_is_eb_inhomog;
            if (iVar36 == 0 ||
                (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)_Var9._M_head_impl
                == (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
              local_288.kstride = 0;
              local_288.nstride = 0;
              local_288.p = (double *)0x0;
              local_288.jstride = 0;
              local_288.begin.x = 1;
              local_288.begin.y = 1;
              local_288.begin.z = 1;
              local_288.end.x = 0;
              local_288.end.y = 0;
              local_288.end.z = 0;
              local_288.ncomp = 0;
            }
            else {
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_288,
                         (FabArray<amrex::FArrayBox> *)
                         (this->super_MLEBABecLap).m_eb_phi.
                         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         .
                         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_4d0]._M_t.
                         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                         ,&mfi);
            }
            iVar18 = local_5d4.bigend.vect[2];
            iVar17 = local_5d4.bigend.vect[1];
            iVar16 = local_5d4.bigend.vect[0];
            iVar15 = local_5d4.smallend.vect[1];
            iVar14 = local_5d4.smallend.vect[0];
            pFVar22 = local_4a8;
            if (local_5d4.smallend.vect[2] <= local_5d4.bigend.vect[2]) {
              uVar79 = local_4e8;
              uVar80 = uStack_4e4;
              uVar13 = local_5d4.smallend.vect[2];
              do {
                if (iVar15 <= iVar17) {
                  lVar25 = (long)(int)uVar13;
                  iVar12 = iVar15;
                  do {
                    if (iVar14 <= iVar16) {
                      lVar32 = (long)iVar12;
                      iVar30 = iVar14;
                      do {
                        iVar30 = iVar30 + 1;
                        uVar20 = local_168.p
                                 [(lVar32 - local_168.begin.y) * local_168.jstride +
                                  (long)(~local_168.begin.x + iVar30) +
                                  (lVar25 - local_168.begin.z) * local_168.kstride].flag & 3;
                        if (uVar20 == 1) {
                          lVar28 = (long)(~fxfab.begin.x + iVar30);
                          lVar26 = (iVar12 - fxfab.begin.y) * fxfab.jstride;
                          lVar27 = (int)(uVar13 - fxfab.begin.z) * fxfab.kstride;
                          local_778 = fxfab.p[lVar26 + lVar28 + lVar27];
                          local_5b8 = fxfab.p[lVar26 + lVar28 + lVar27 + fxfab.nstride * 2];
                          dStack_5b0 = fxfab.p[lVar26 + lVar28 + lVar27 + fxfab.nstride];
                          lVar29 = (lVar32 - local_528.begin.y) * local_528.jstride;
                          lVar34 = (lVar25 - local_528.begin.z) * local_528.kstride;
                          dVar57 = local_528.p[lVar29 + (~local_528.begin.x + iVar30) + lVar34];
                          if ((0.0 < dVar57) && (dVar57 < 1.0)) {
                            dVar56 = local_2c8.p
                                     [(lVar32 - local_2c8.begin.y) * local_2c8.jstride +
                                      (long)(~local_2c8.begin.x + iVar30) +
                                      (lVar25 - local_2c8.begin.z) * local_2c8.kstride];
                            iVar41 = (-(uint)(dVar56 < 0.0) | 1) + iVar12;
                            dVar61 = (local_2c8.p +
                                     (lVar32 - local_2c8.begin.y) * local_2c8.jstride +
                                     (long)(~local_2c8.begin.x + iVar30) +
                                     (lVar25 - local_2c8.begin.z) * local_2c8.kstride)
                                     [local_2c8.nstride];
                            lVar40 = (long)((iVar30 - local_6b8.begin.x) + -2);
                            lVar39 = (iVar41 - local_6b8.begin.y) * local_6b8.jstride;
                            lVar35 = (int)(uVar13 - local_6b8.begin.z) * local_6b8.kstride;
                            if ((local_6b8.p[lVar39 + lVar40 + lVar35] == 0) &&
                               (local_6b8.p[lVar39 + (~local_6b8.begin.x + iVar30) + lVar35] == 0))
                            {
                              dVar56 = 0.0;
                            }
                            else {
                              dVar56 = ABS(dVar56);
                            }
                            iVar49 = (-(uint)(dVar61 < 0.0) | 1) + uVar13;
                            lVar39 = local_6b8.jstride * (iVar12 - local_6b8.begin.y);
                            lVar35 = local_6b8.kstride * (iVar49 - local_6b8.begin.z);
                            if ((local_6b8.p[lVar39 + lVar40 + lVar35] == 0) &&
                               (local_6b8.p[lVar39 + (~local_6b8.begin.x + iVar30) + lVar35] == 0))
                            {
                              dVar61 = 0.0;
                            }
                            else {
                              dVar61 = ABS(dVar61);
                            }
                            dVar64 = (1.0 - dVar56) * (1.0 - dVar61);
                            dVar65 = (1.0 - dVar61) * dVar56;
                            lVar35 = (iVar41 - fxfab.begin.y) * fxfab.jstride;
                            pdVar1 = fxfab.p + lVar35 + lVar28 + lVar27;
                            dVar62 = (1.0 - dVar56) * dVar61;
                            lVar39 = (iVar49 - fxfab.begin.z) * fxfab.kstride;
                            pdVar2 = fxfab.p + lVar26 + lVar28 + lVar39;
                            dVar56 = dVar56 * dVar61;
                            pdVar3 = fxfab.p + lVar35 + lVar28 + lVar39;
                            local_778 = *pdVar3 * dVar56 +
                                        *pdVar2 * dVar62 + local_778 * dVar64 + *pdVar1 * dVar65;
                            local_5b8 = pdVar3[fxfab.nstride * 2] * dVar56 +
                                        pdVar2[fxfab.nstride * 2] * dVar62 +
                                        dVar64 * local_5b8 + pdVar1[fxfab.nstride * 2] * dVar65;
                            dStack_5b0 = pdVar3[fxfab.nstride] * dVar56 +
                                         pdVar2[fxfab.nstride] * dVar62 +
                                         dVar64 * dStack_5b0 + pdVar1[fxfab.nstride] * dVar65;
                          }
                          lVar28 = (long)(iVar30 - fxfab.begin.x);
                          pdVar1 = fxfab.p + lVar26 + lVar28 + lVar27;
                          local_668 = local_528.p[lVar29 + (iVar30 - local_528.begin.x) + lVar34];
                          local_790 = *pdVar1;
                          local_678 = pdVar1[fxfab.nstride * 2];
                          dStack_670 = pdVar1[fxfab.nstride];
                          uStack_660 = 0;
                          if ((0.0 < local_668) && (local_668 < 1.0)) {
                            dVar56 = local_2c8.p
                                     [(lVar32 - local_2c8.begin.y) * local_2c8.jstride +
                                      (long)(iVar30 - local_2c8.begin.x) +
                                      (lVar25 - local_2c8.begin.z) * local_2c8.kstride];
                            iVar41 = (-(uint)(dVar56 < 0.0) | 1) + iVar12;
                            dVar61 = (local_2c8.p +
                                     (lVar32 - local_2c8.begin.y) * local_2c8.jstride +
                                     (long)(iVar30 - local_2c8.begin.x) +
                                     (lVar25 - local_2c8.begin.z) * local_2c8.kstride)
                                     [local_2c8.nstride];
                            lVar29 = (iVar41 - local_6b8.begin.y) * local_6b8.jstride;
                            lVar34 = (int)(uVar13 - local_6b8.begin.z) * local_6b8.kstride;
                            if ((local_6b8.p[lVar29 + (~local_6b8.begin.x + iVar30) + lVar34] == 0)
                               && (local_6b8.p[lVar29 + (iVar30 - local_6b8.begin.x) + lVar34] == 0)
                               ) {
                              dVar56 = 0.0;
                            }
                            else {
                              dVar56 = ABS(dVar56);
                            }
                            iVar49 = (-(uint)(dVar61 < 0.0) | 1) + uVar13;
                            lVar34 = local_6b8.jstride * (iVar12 - local_6b8.begin.y);
                            lVar29 = local_6b8.kstride * (iVar49 - local_6b8.begin.z);
                            if ((local_6b8.p[lVar34 + (~local_6b8.begin.x + iVar30) + lVar29] == 0)
                               && (local_6b8.p[lVar34 + (iVar30 - local_6b8.begin.x) + lVar29] == 0)
                               ) {
                              dVar61 = 0.0;
                            }
                            else {
                              dVar61 = ABS(dVar61);
                            }
                            dVar64 = (1.0 - dVar56) * (1.0 - dVar61);
                            dVar65 = (1.0 - dVar61) * dVar56;
                            lVar29 = fxfab.jstride * (iVar41 - fxfab.begin.y);
                            pdVar1 = fxfab.p + lVar29 + lVar28 + lVar27;
                            dVar62 = (1.0 - dVar56) * dVar61;
                            lVar27 = fxfab.kstride * (iVar49 - fxfab.begin.z);
                            pdVar2 = fxfab.p + lVar26 + lVar28 + lVar27;
                            dVar56 = dVar56 * dVar61;
                            pdVar3 = fxfab.p + lVar29 + lVar28 + lVar27;
                            local_790 = *pdVar3 * dVar56 +
                                        *pdVar2 * dVar62 + local_790 * dVar64 + *pdVar1 * dVar65;
                            local_678 = pdVar3[fxfab.nstride * 2] * dVar56 +
                                        pdVar2[fxfab.nstride * 2] * dVar62 +
                                        dVar64 * local_678 + pdVar1[fxfab.nstride * 2] * dVar65;
                            dStack_670 = pdVar3[fxfab.nstride] * dVar56 +
                                         pdVar2[fxfab.nstride] * dVar62 +
                                         dVar64 * dStack_670 + pdVar1[fxfab.nstride] * dVar65;
                          }
                          lVar27 = (long)(~fyfab.begin.x + iVar30);
                          lVar26 = (iVar12 - fyfab.begin.y) * fyfab.jstride;
                          lVar28 = (int)(uVar13 - fyfab.begin.z) * fyfab.kstride;
                          lVar29 = (lVar25 - local_568.begin.z) * local_568.kstride;
                          local_728._0_8_ = local_568.p;
                          dVar56 = local_568.p
                                   [(iVar12 - local_568.begin.y) * local_568.jstride +
                                    (~local_568.begin.x + iVar30) + lVar29];
                          local_6e8 = fyfab.p[lVar26 + lVar27 + lVar28 + fyfab.nstride * 2];
                          dStack_6e0 = fyfab.p[lVar26 + lVar27 + lVar28 + fyfab.nstride];
                          local_7a0 = fyfab.p[lVar26 + lVar27 + lVar28];
                          if ((0.0 < dVar56) && (dVar56 < 1.0)) {
                            dVar61 = local_308.p
                                     [(lVar32 - local_308.begin.y) * local_308.jstride +
                                      (long)(~local_308.begin.x + iVar30) +
                                      (lVar25 - local_308.begin.z) * local_308.kstride];
                            uVar20 = -(uint)(dVar61 < 0.0) | 1;
                            dVar62 = (local_308.p +
                                     (lVar32 - local_308.begin.y) * local_308.jstride +
                                     (long)(~local_308.begin.x + iVar30) +
                                     (lVar25 - local_308.begin.z) * local_308.kstride)
                                     [local_308.nstride];
                            lVar35 = (long)(int)((uVar20 - local_6b8.begin.x) + iVar30 + -1);
                            lVar39 = (~local_6b8.begin.y + iVar12) * local_6b8.jstride;
                            lVar34 = (int)(uVar13 - local_6b8.begin.z) * local_6b8.kstride;
                            if ((local_6b8.p[lVar39 + lVar35 + lVar34] == 0) &&
                               (local_6b8.p
                                [(iVar12 - local_6b8.begin.y) * local_6b8.jstride + lVar35 + lVar34]
                                == 0)) {
                              dVar61 = 0.0;
                            }
                            else {
                              dVar61 = ABS(dVar61);
                            }
                            iVar41 = (-(uint)(dVar62 < 0.0) | 1) + uVar13;
                            lVar34 = local_6b8.kstride * (iVar41 - local_6b8.begin.z);
                            if ((local_6b8.p[lVar39 + (~local_6b8.begin.x + iVar30) + lVar34] == 0)
                               && (local_6b8.p
                                   [local_6b8.jstride * (iVar12 - local_6b8.begin.y) +
                                    (~local_6b8.begin.x + iVar30) + lVar34] == 0)) {
                              dVar62 = 0.0;
                            }
                            else {
                              dVar62 = ABS(dVar62);
                            }
                            dVar65 = (1.0 - dVar61) * (1.0 - dVar62);
                            dVar66 = (1.0 - dVar62) * dVar61;
                            lVar34 = (long)(int)(iVar30 + (uVar20 - fyfab.begin.x) + -1);
                            pdVar1 = fyfab.p + lVar26 + lVar34 + lVar28;
                            dVar64 = (1.0 - dVar61) * dVar62;
                            lVar35 = (iVar41 - fyfab.begin.z) * fyfab.kstride;
                            pdVar2 = fyfab.p + lVar26 + lVar27 + lVar35;
                            dVar61 = dVar61 * dVar62;
                            pdVar3 = fyfab.p + lVar26 + lVar34 + lVar35;
                            local_7a0 = *pdVar3 * dVar61 +
                                        *pdVar2 * dVar64 + local_7a0 * dVar65 + *pdVar1 * dVar66;
                            local_6e8 = pdVar3[fyfab.nstride * 2] * dVar61 +
                                        pdVar2[fyfab.nstride * 2] * dVar64 +
                                        dVar65 * local_6e8 + pdVar1[fyfab.nstride * 2] * dVar66;
                            dStack_6e0 = pdVar3[fyfab.nstride] * dVar61 +
                                         pdVar2[fyfab.nstride] * dVar64 +
                                         dVar65 * dStack_6e0 + pdVar1[fyfab.nstride] * dVar66;
                          }
                          iVar41 = (int)(lVar32 + 1);
                          lVar26 = fyfab.jstride * (iVar41 - fyfab.begin.y);
                          pdVar1 = fyfab.p + lVar26 + lVar27 + lVar28;
                          dVar61 = local_568.p
                                   [local_568.jstride * (iVar41 - local_568.begin.y) +
                                    (~local_568.begin.x + iVar30) + lVar29];
                          local_7b0 = *pdVar1;
                          local_758 = pdVar1[fyfab.nstride * 2];
                          dStack_750 = pdVar1[fyfab.nstride];
                          if ((0.0 < dVar61) && (dVar61 < 1.0)) {
                            dVar62 = local_308.p
                                     [((lVar32 + 1) - (long)local_308.begin.y) * local_308.jstride +
                                      (long)(~local_308.begin.x + iVar30) +
                                      (lVar25 - local_308.begin.z) * local_308.kstride];
                            uVar20 = -(uint)(dVar62 < 0.0) | 1;
                            dVar64 = (local_308.p +
                                     ((lVar32 + 1) - (long)local_308.begin.y) * local_308.jstride +
                                     (long)(~local_308.begin.x + iVar30) +
                                     (lVar25 - local_308.begin.z) * local_308.kstride)
                                     [local_308.nstride];
                            lVar29 = (long)(int)((uVar20 - local_6b8.begin.x) + iVar30 + -1);
                            lVar34 = (iVar12 - local_6b8.begin.y) * local_6b8.jstride;
                            lVar35 = (int)(uVar13 - local_6b8.begin.z) * local_6b8.kstride;
                            if ((local_6b8.p[lVar34 + lVar29 + lVar35] == 0) &&
                               (local_6b8.p
                                [(iVar41 - local_6b8.begin.y) * local_6b8.jstride + lVar29 + lVar35]
                                == 0)) {
                              dVar62 = 0.0;
                            }
                            else {
                              dVar62 = ABS(dVar62);
                            }
                            iVar49 = (-(uint)(dVar64 < 0.0) | 1) + uVar13;
                            lVar29 = local_6b8.kstride * (iVar49 - local_6b8.begin.z);
                            if ((local_6b8.p[lVar34 + (~local_6b8.begin.x + iVar30) + lVar29] == 0)
                               && (local_6b8.p
                                   [local_6b8.jstride * (iVar41 - local_6b8.begin.y) +
                                    (~local_6b8.begin.x + iVar30) + lVar29] == 0)) {
                              dVar64 = 0.0;
                            }
                            else {
                              dVar64 = ABS(dVar64);
                            }
                            dVar66 = (1.0 - dVar62) * (1.0 - dVar64);
                            dVar69 = (1.0 - dVar64) * dVar62;
                            lVar29 = (long)(int)((uVar20 - fyfab.begin.x) + iVar30 + -1);
                            pdVar1 = fyfab.p + lVar26 + lVar29 + lVar28;
                            dVar65 = (1.0 - dVar62) * dVar64;
                            lVar28 = fyfab.kstride * (iVar49 - fyfab.begin.z);
                            pdVar2 = fyfab.p + lVar26 + lVar27 + lVar28;
                            dVar62 = dVar62 * dVar64;
                            pdVar3 = fyfab.p + lVar26 + lVar29 + lVar28;
                            local_7b0 = *pdVar3 * dVar62 +
                                        *pdVar2 * dVar65 + local_7b0 * dVar66 + *pdVar1 * dVar69;
                            local_758 = pdVar3[fyfab.nstride * 2] * dVar62 +
                                        pdVar2[fyfab.nstride * 2] * dVar65 +
                                        dVar66 * local_758 + pdVar1[fyfab.nstride * 2] * dVar69;
                            dStack_750 = pdVar3[fyfab.nstride] * dVar62 +
                                         pdVar2[fyfab.nstride] * dVar65 +
                                         dVar66 * dStack_750 + pdVar1[fyfab.nstride] * dVar69;
                          }
                          local_728._0_4_ = fzfab.begin.x;
                          lVar27 = (long)(~fzfab.begin.x + iVar30);
                          lVar26 = (iVar12 - fzfab.begin.y) * fzfab.jstride;
                          lVar28 = (int)(uVar13 - fzfab.begin.z) * fzfab.kstride;
                          dVar62 = fzfab.p[lVar26 + lVar27 + lVar28];
                          lVar29 = (lVar32 - local_5a8.begin.y) * local_5a8.jstride;
                          local_738 = fzfab.p[lVar26 + lVar27 + lVar28 + fzfab.nstride * 2];
                          dStack_730 = fzfab.p[lVar26 + lVar27 + lVar28 + fzfab.nstride];
                          dVar64 = local_5a8.p
                                   [lVar29 + (long)(~local_5a8.begin.x + iVar30) +
                                             (int)(uVar13 - local_5a8.begin.z) * local_5a8.kstride];
                          if ((0.0 < dVar64) && (dVar64 < 1.0)) {
                            dVar65 = local_348.p
                                     [(lVar32 - local_348.begin.y) * local_348.jstride +
                                      (long)(~local_348.begin.x + iVar30) +
                                      (lVar25 - local_348.begin.z) * local_348.kstride];
                            uVar20 = -(uint)(dVar65 < 0.0) | 1;
                            dVar66 = (local_348.p +
                                     (lVar32 - local_348.begin.y) * local_348.jstride +
                                     (long)(~local_348.begin.x + iVar30) +
                                     (lVar25 - local_348.begin.z) * local_348.kstride)
                                     [local_348.nstride];
                            lVar39 = (long)(int)((uVar20 - local_6b8.begin.x) + iVar30 + -1);
                            lVar35 = (iVar12 - local_6b8.begin.y) * local_6b8.jstride;
                            lVar34 = (int)(~local_6b8.begin.z + uVar13) * local_6b8.kstride;
                            if ((local_6b8.p[lVar35 + lVar39 + lVar34] == 0) &&
                               (local_6b8.p
                                [lVar35 + lVar39 + (int)(uVar13 - local_6b8.begin.z) *
                                                   local_6b8.kstride] == 0)) {
                              dVar65 = 0.0;
                            }
                            else {
                              dVar65 = ABS(dVar65);
                            }
                            iVar49 = (-(uint)(dVar66 < 0.0) | 1) + iVar12;
                            lVar35 = local_6b8.jstride * (iVar49 - local_6b8.begin.y);
                            if ((local_6b8.p[lVar35 + (~local_6b8.begin.x + iVar30) + lVar34] == 0)
                               && (local_6b8.p
                                   [lVar35 + (long)(~local_6b8.begin.x + iVar30) +
                                             local_6b8.kstride * (int)(uVar13 - local_6b8.begin.z)]
                                   == 0)) {
                              dVar66 = 0.0;
                            }
                            else {
                              dVar66 = ABS(dVar66);
                            }
                            dVar70 = (1.0 - dVar65) * (1.0 - dVar66);
                            dVar72 = (1.0 - dVar66) * dVar65;
                            lVar34 = (long)(int)(iVar30 + (uVar20 - fzfab.begin.x) + -1);
                            pdVar1 = fzfab.p + lVar26 + lVar34 + lVar28;
                            dVar69 = (1.0 - dVar65) * dVar66;
                            lVar35 = (iVar49 - fzfab.begin.y) * fzfab.jstride;
                            pdVar2 = fzfab.p + lVar35 + lVar27 + lVar28;
                            dVar65 = dVar65 * dVar66;
                            pdVar3 = fzfab.p + lVar35 + lVar34 + lVar28;
                            dVar62 = *pdVar3 * dVar65 +
                                     *pdVar2 * dVar69 + dVar62 * dVar70 + *pdVar1 * dVar72;
                            local_738 = pdVar3[fzfab.nstride * 2] * dVar65 +
                                        pdVar2[fzfab.nstride * 2] * dVar69 +
                                        dVar70 * local_738 + pdVar1[fzfab.nstride * 2] * dVar72;
                            dStack_730 = pdVar3[fzfab.nstride] * dVar65 +
                                         pdVar2[fzfab.nstride] * dVar69 +
                                         dVar70 * dStack_730 + pdVar1[fzfab.nstride] * dVar72;
                          }
                          iVar49 = (int)(lVar25 + 1);
                          lVar28 = fzfab.kstride * (iVar49 - fzfab.begin.z);
                          pdVar1 = fzfab.p + lVar26 + lVar27 + lVar28;
                          dVar65 = local_5a8.p
                                   [lVar29 + (long)(~local_5a8.begin.x + iVar30) +
                                             local_5a8.kstride * (iVar49 - local_5a8.begin.z)];
                          local_7c0 = *pdVar1;
                          dVar66 = pdVar1[fzfab.nstride * 2];
                          dVar69 = pdVar1[fzfab.nstride];
                          if ((0.0 < dVar65) && (dVar65 < 1.0)) {
                            dVar70 = local_348.p
                                     [(lVar32 - local_348.begin.y) * local_348.jstride +
                                      (long)(~local_348.begin.x + iVar30) +
                                      ((lVar25 + 1) - (long)local_348.begin.z) * local_348.kstride];
                            uVar20 = -(uint)(dVar70 < 0.0) | 1;
                            dVar72 = (local_348.p +
                                     (lVar32 - local_348.begin.y) * local_348.jstride +
                                     (long)(~local_348.begin.x + iVar30) +
                                     ((lVar25 + 1) - (long)local_348.begin.z) * local_348.kstride)
                                     [local_348.nstride];
                            iVar37 = (-(uint)(dVar72 < 0.0) | 1) + iVar12;
                            lVar34 = (lVar25 - local_6b8.begin.z) * local_6b8.kstride;
                            lVar35 = fzfab.jstride * (iVar37 - fzfab.begin.y);
                            lVar29 = (long)(int)((uVar20 - fzfab.begin.x) + iVar30 + -1);
                            pdVar1 = fzfab.p + lVar26 + lVar29 + lVar28;
                            pdVar2 = fzfab.p + lVar35 + lVar27 + lVar28;
                            pdVar3 = fzfab.p + lVar35 + lVar29 + lVar28;
                            auVar68._0_4_ =
                                 -(uint)(local_6b8.p
                                         [(iVar12 - local_6b8.begin.y) * local_6b8.jstride +
                                          (int)((uVar20 - local_6b8.begin.x) + iVar30 + -1) + lVar34
                                         ] == 0);
                            auVar68._4_4_ =
                                 -(uint)(local_6b8.p
                                         [(iVar12 - local_6b8.begin.y) * local_6b8.jstride +
                                          (int)((uVar20 - local_6b8.begin.x) + iVar30 + -1) + lVar34
                                         ] == 0);
                            auVar68._8_4_ =
                                 -(uint)(local_6b8.p
                                         [(iVar37 - local_6b8.begin.y) * local_6b8.jstride +
                                          (~local_6b8.begin.x + iVar30) + lVar34] == 0);
                            auVar68._12_4_ =
                                 -(uint)(local_6b8.p
                                         [(iVar37 - local_6b8.begin.y) * local_6b8.jstride +
                                          (~local_6b8.begin.x + iVar30) + lVar34] == 0);
                            auVar10._8_8_ = ABS(dVar72);
                            auVar10._0_8_ = ABS(dVar70);
                            dVar67 = SUB168(~auVar68 & auVar10,0);
                            dVar73 = SUB168(~auVar68 & auVar10,8);
                            dVar71 = (1.0 - dVar67) * (1.0 - dVar73);
                            dVar72 = (1.0 - dVar73) * dVar67;
                            dVar70 = (1.0 - dVar67) * dVar73;
                            dVar67 = dVar67 * dVar73;
                            local_7c0 = *pdVar3 * dVar67 +
                                        *pdVar2 * dVar70 + local_7c0 * dVar71 + *pdVar1 * dVar72;
                            dVar66 = pdVar3[fzfab.nstride * 2] * dVar67 +
                                     pdVar2[fzfab.nstride * 2] * dVar70 +
                                     dVar71 * dVar66 + pdVar1[fzfab.nstride * 2] * dVar72;
                            dVar69 = pdVar3[fzfab.nstride] * dVar67 +
                                     pdVar2[fzfab.nstride] * dVar70 +
                                     dVar71 * dVar69 + pdVar1[fzfab.nstride] * dVar72;
                          }
                          dVar70 = local_1a8.p
                                   [(lVar32 - local_1a8.begin.y) * local_1a8.jstride +
                                    (long)(~local_1a8.begin.x + iVar30) +
                                    (lVar25 - local_1a8.begin.z) * local_1a8.kstride];
                          auVar11._8_4_ = SUB84(dVar69,0);
                          auVar11._0_8_ = dVar66;
                          auVar11._12_4_ = (int)((ulong)dVar69 >> 0x20);
                          if ((_Head_base<0UL,_amrex::MultiFab_*,_false>)_Var9._M_head_impl ==
                              (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
                            dVar61 = 0.0;
                            dVar64 = 0.0;
                            dVar57 = 0.0;
                            dVar56 = (double)CONCAT44(uStack_4e4,local_4e8);
                          }
                          else {
                            local_668 = local_668 - dVar57;
                            dVar65 = dVar65 - dVar64;
                            dVar61 = dVar61 - dVar56;
                            local_728._8_4_ = SUB84(dVar61,0);
                            local_728._0_8_ = dVar61;
                            local_728._12_4_ = (int)((ulong)dVar61 >> 0x20);
                            dVar64 = dVar65 * dVar65 + local_668 * local_668 + dVar61 * dVar61;
                            uStack_660 = 0;
                            if (dVar64 < 0.0) {
                              dVar64 = sqrt(dVar64);
                            }
                            else {
                              dVar64 = SQRT(dVar64);
                            }
                            if (iVar36 == 0) {
                              local_6f8 = 0.0;
                              dStack_6f0 = 0.0;
                              dVar57 = 0.0;
                            }
                            else {
                              lVar26 = (long)(~local_288.begin.x + iVar30);
                              lVar27 = (lVar32 - local_288.begin.y) * local_288.jstride;
                              lVar28 = (lVar25 - local_288.begin.z) * local_288.kstride;
                              dVar57 = local_288.p[lVar27 + lVar26 + lVar28];
                              local_6f8 = local_288.p
                                          [lVar27 + lVar26 + lVar28 + local_288.nstride * 2];
                              dStack_6f0 = local_288.p[lVar27 + lVar26 + lVar28 + local_288.nstride]
                              ;
                            }
                            dVar64 = 1.0 / dVar64;
                            dVar69 = -local_668 * dVar64;
                            dVar72 = dVar64 * -dVar65;
                            dVar64 = dVar64 * -dVar61;
                            dVar56 = (dVar70 * dVar70 + -0.25) / (dVar70 + dVar70);
                            if (dVar56 <= 0.3) {
                              dVar56 = 0.3;
                            }
                            dVar67 = ABS(dVar64);
                            if (ABS(dVar64) <= ABS(dVar69)) {
                              dVar67 = ABS(dVar69);
                            }
                            dVar73 = ABS(dVar72);
                            if (ABS(dVar72) <= dVar67) {
                              dVar73 = dVar67;
                            }
                            dVar56 = dVar56 / dVar73;
                            dVar67 = 1.0 / dVar56;
                            lVar28 = (lVar32 - local_228.begin.y) * local_228.jstride;
                            lVar26 = (lVar25 - local_228.begin.z) * local_228.kstride;
                            lVar27 = (long)(~local_228.begin.x + iVar30);
                            dVar73 = local_228.p[lVar28 + lVar27 + lVar26] - dVar56 * dVar69;
                            if (dVar69 <= 0.0) {
                              dVar73 = -dVar73;
                            }
                            dVar71 = local_228.p[lVar28 + lVar27 + lVar26 + local_228.nstride * 2] -
                                     dVar56 * dVar72;
                            dVar56 = local_228.p[lVar28 + lVar27 + lVar26 + local_228.nstride] -
                                     dVar56 * dVar64;
                            uVar54 = -(ulong)(0.0 < dVar72);
                            uVar55 = -(ulong)(0.0 < dVar64);
                            dVar58 = (double)(~uVar54 & (ulong)-dVar71 | (ulong)dVar71 & uVar54);
                            dVar56 = (double)(~uVar55 & (ulong)-dVar56 | (ulong)dVar56 & uVar55);
                            dVar75 = dVar73 * dVar58;
                            dVar76 = dVar73 * dVar56;
                            dVar77 = dVar56 * dVar58;
                            dVar71 = dVar76 * dVar58;
                            dVar81 = dVar73 + 1.0 + dVar56 + dVar58 + dVar76 + dVar75 + dVar77 +
                                     dVar71;
                            lVar35 = (long)(~local_1e8.begin.x + iVar30);
                            lVar29 = (iVar12 - local_1e8.begin.y) * local_1e8.jstride;
                            lVar26 = (int)(uVar13 - local_1e8.begin.z) * local_1e8.kstride;
                            lVar27 = (int)((((uint)uVar54 | 1) + uVar13) - local_1e8.begin.z) *
                                     local_1e8.kstride;
                            dVar78 = ((-dVar58 - dVar75) - dVar77) - dVar71;
                            lVar34 = (int)((((uint)uVar55 | 1) + iVar12) - local_1e8.begin.y) *
                                     local_1e8.jstride;
                            dVar56 = ((-dVar56 - dVar76) - dVar77) - dVar71;
                            dVar77 = dVar77 + dVar71;
                            dVar74 = ((-dVar73 - dVar76) - dVar75) - dVar71;
                            lVar28 = (long)(int)(~local_1e8.begin.x + iVar30 + -1 +
                                                (uint)(dVar69 <= 0.0) * 2);
                            dVar75 = dVar75 + dVar71;
                            dVar76 = dVar76 + dVar71;
                            dVar73 = local_e8.p
                                     [(lVar32 - local_e8.begin.y) * local_e8.jstride +
                                      (long)(~local_e8.begin.x + iVar30) +
                                      (lVar25 - local_e8.begin.z) * local_e8.kstride];
                            dVar58 = (dVar57 - ((local_1e8.p[lVar34 + lVar28 + lVar26] * dVar76 +
                                                local_1e8.p[lVar29 + lVar28 + lVar27] * dVar75 +
                                                local_1e8.p[lVar29 + lVar28 + lVar26] * dVar74 +
                                                local_1e8.p[lVar34 + lVar35 + lVar27] * dVar77 +
                                                local_1e8.p[lVar34 + lVar35 + lVar26] * dVar56 +
                                                local_1e8.p[lVar29 + lVar35 + lVar26] * dVar81 +
                                                local_1e8.p[lVar29 + lVar35 + lVar27] * dVar78) -
                                               local_1e8.p[lVar34 + lVar28 + lVar27] * dVar71)) *
                                     dVar67;
                            dVar63 = dVar67 * (local_6f8 -
                                              ((local_1e8.p
                                                [lVar34 + lVar28 + lVar26 + local_1e8.nstride * 2] *
                                                dVar76 + local_1e8.p
                                                         [lVar29 + lVar28 + lVar27 + local_1e8.
                                                                                     nstride * 2] *
                                                         dVar75 + local_1e8.p
                                                                  [lVar29 + lVar28 + lVar26 + 
                                                  local_1e8.nstride * 2] * dVar74 +
                                                  local_1e8.p
                                                  [lVar34 + lVar35 + lVar27 + local_1e8.nstride * 2]
                                                  * dVar77 +
                                                  local_1e8.p
                                                  [lVar34 + lVar35 + lVar26 + local_1e8.nstride * 2]
                                                  * dVar56 +
                                                  local_1e8.p
                                                  [lVar29 + lVar35 + lVar26 + local_1e8.nstride * 2]
                                                  * dVar81 +
                                                  local_1e8.p
                                                  [lVar29 + lVar35 + lVar27 + local_1e8.nstride * 2]
                                                  * dVar78) -
                                              local_1e8.p
                                              [lVar34 + lVar28 + lVar27 + local_1e8.nstride * 2] *
                                              dVar71));
                            dVar67 = dVar67 * (dStack_6f0 -
                                              ((local_1e8.p
                                                [lVar34 + lVar28 + lVar26 + local_1e8.nstride] *
                                                dVar76 + local_1e8.p
                                                         [lVar29 + lVar28 + lVar27 + local_1e8.
                                                                                     nstride] *
                                                         dVar75 + local_1e8.p
                                                                  [lVar29 + lVar28 + lVar26 + 
                                                  local_1e8.nstride] * dVar74 +
                                                  local_1e8.p
                                                  [lVar34 + lVar35 + lVar27 + local_1e8.nstride] *
                                                  dVar77 + local_1e8.p
                                                           [lVar34 + lVar35 + lVar26 + local_1e8.
                                                                                       nstride] *
                                                           dVar56 + local_1e8.p
                                                                    [lVar29 + lVar35 + lVar26 + 
                                                  local_1e8.nstride] * dVar81 +
                                                  local_1e8.p
                                                  [lVar29 + lVar35 + lVar27 + local_1e8.nstride] *
                                                  dVar78) -
                                              local_1e8.p
                                              [lVar34 + lVar28 + lVar27 + local_1e8.nstride] *
                                              dVar71));
                            dVar71 = (dVar73 * -0.6666666666666666 +
                                     local_128.p
                                     [(lVar32 - local_128.begin.y) * local_128.jstride +
                                      (long)(~local_128.begin.x + iVar30) +
                                      (lVar25 - local_128.begin.z) * local_128.kstride]) *
                                     (dVar69 * dVar58 + dVar67 * dVar64 + dVar63 * dVar72);
                            dVar56 = (double)CONCAT44(uStack_4e4,local_4e8);
                            dVar57 = (dVar69 * dVar63 * dVar73 * dVar65 +
                                     (dVar69 * dVar58 * dVar73 + dVar71) * local_668 +
                                     dVar69 * dVar67 * dVar73 * dVar61) * dVar56;
                            dVar61 = (dVar65 * (dVar63 * dVar72 * dVar73 + dVar71) +
                                     local_668 * dVar73 * dVar58 * dVar72 +
                                     dVar61 * dVar67 * dVar72 * dVar73) * (double)local_238._0_8_;
                            dVar64 = (dVar65 * dVar64 * dVar63 * dVar73 +
                                     local_668 * dVar73 * dVar58 * dVar64 +
                                     (double)local_728._8_8_ * (dVar67 * dVar64 * dVar73 + dVar71))
                                     * (double)local_238._8_8_;
                          }
                          dVar70 = dVar7 / dVar70;
                          lVar26 = (lVar32 - local_528.begin.y) * local_528.jstride;
                          lVar29 = (lVar25 - local_528.begin.z) * local_528.kstride;
                          lVar35 = (lVar25 - local_568.begin.z) * local_568.kstride;
                          lVar27 = (lVar32 - local_5a8.begin.y) * local_5a8.jstride;
                          lVar28 = (lVar32 - axfab.begin.y) * axfab.jstride;
                          lVar34 = (lVar25 - axfab.begin.z) * axfab.kstride;
                          axfab.p[lVar28 + (~axfab.begin.x + iVar30) + lVar34] =
                               (dVar57 * dVar56 +
                               (local_7c0 *
                                local_5a8.p
                                [lVar27 + (long)(~local_5a8.begin.x + iVar30) +
                                          (iVar49 - local_5a8.begin.z) * local_5a8.kstride] -
                               dVar62 * local_5a8.p
                                        [lVar27 + (long)(~local_5a8.begin.x + iVar30) +
                                                  (int)(uVar13 - local_5a8.begin.z) *
                                                  local_5a8.kstride]) * dVar6 +
                               (local_790 *
                                local_528.p[lVar26 + (iVar30 - local_528.begin.x) + lVar29] -
                               local_778 *
                               local_528.p[lVar26 + ((iVar30 - local_528.begin.x) + -1) + lVar29]) *
                               dVar56 + (local_7b0 *
                                         local_568.p
                                         [(iVar41 - local_568.begin.y) * local_568.jstride +
                                          (~local_568.begin.x + iVar30) + lVar35] -
                                        local_7a0 *
                                        local_568.p
                                        [(iVar12 - local_568.begin.y) * local_568.jstride +
                                         (~local_568.begin.x + iVar30) + lVar35]) * dVar5) * dVar70
                               + axfab.p[lVar28 + (~axfab.begin.x + iVar30) + lVar34];
                          lVar26 = (lVar32 - local_528.begin.y) * local_528.jstride;
                          lVar29 = (lVar25 - local_528.begin.z) * local_528.kstride;
                          lVar35 = (lVar25 - local_568.begin.z) * local_568.kstride;
                          lVar27 = (lVar32 - local_5a8.begin.y) * local_5a8.jstride;
                          dStack_760 = auVar11._8_8_;
                          lVar28 = (lVar32 - axfab.begin.y) * axfab.jstride;
                          lVar34 = (lVar25 - axfab.begin.z) * axfab.kstride;
                          axfab.p[lVar28 + (long)(~axfab.begin.x + iVar30) + lVar34 + axfab.nstride]
                               = (dVar64 * dVar56 +
                                 (dStack_760 *
                                  local_5a8.p
                                  [lVar27 + (long)(~local_5a8.begin.x + iVar30) +
                                            (iVar49 - local_5a8.begin.z) * local_5a8.kstride] -
                                 dStack_730 *
                                 local_5a8.p
                                 [lVar27 + (long)(~local_5a8.begin.x + iVar30) +
                                           (int)(uVar13 - local_5a8.begin.z) * local_5a8.kstride]) *
                                 dVar6 + (dStack_670 *
                                          local_528.p
                                          [lVar26 + (iVar30 - local_528.begin.x) + lVar29] -
                                         dStack_5b0 *
                                         local_528.p
                                         [lVar26 + ((iVar30 - local_528.begin.x) + -1) + lVar29]) *
                                         dVar56 + (dStack_750 *
                                                   local_568.p
                                                   [(iVar41 - local_568.begin.y) * local_568.jstride
                                                    + (~local_568.begin.x + iVar30) + lVar35] -
                                                  dStack_6e0 *
                                                  local_568.p
                                                  [(iVar12 - local_568.begin.y) * local_568.jstride
                                                   + (~local_568.begin.x + iVar30) + lVar35]) *
                                                  dVar5) * dVar70 +
                                 axfab.p[lVar28 + (long)(~axfab.begin.x + iVar30) +
                                                  lVar34 + axfab.nstride];
                          lVar26 = (lVar32 - local_528.begin.y) * local_528.jstride;
                          lVar29 = (lVar25 - local_528.begin.z) * local_528.kstride;
                          lVar35 = (lVar25 - local_568.begin.z) * local_568.kstride;
                          lVar27 = (lVar32 - local_5a8.begin.y) * local_5a8.jstride;
                          uVar79 = SUB84(dVar56,0);
                          uVar80 = (undefined4)((ulong)dVar56 >> 0x20);
                          lVar28 = (lVar32 - axfab.begin.y) * axfab.jstride;
                          lVar34 = (lVar25 - axfab.begin.z) * axfab.kstride;
                          axfab.p[lVar28 + (long)(~axfab.begin.x + iVar30) +
                                           lVar34 + axfab.nstride * 2] =
                               (dVar61 * dVar56 +
                               (dVar66 * local_5a8.p
                                         [lVar27 + (long)(~local_5a8.begin.x + iVar30) +
                                                   (iVar49 - local_5a8.begin.z) * local_5a8.kstride]
                               - local_738 *
                                 local_5a8.p
                                 [lVar27 + (long)(~local_5a8.begin.x + iVar30) +
                                           (int)(uVar13 - local_5a8.begin.z) * local_5a8.kstride]) *
                               dVar6 + (local_678 *
                                        local_528.p[lVar26 + (iVar30 - local_528.begin.x) + lVar29]
                                       - local_5b8 *
                                         local_528.p
                                         [lVar26 + ((iVar30 - local_528.begin.x) + -1) + lVar29]) *
                                       dVar56 + (local_758 *
                                                 local_568.p
                                                 [(iVar41 - local_568.begin.y) * local_568.jstride +
                                                  (~local_568.begin.x + iVar30) + lVar35] -
                                                local_6e8 *
                                                local_568.p
                                                [(iVar12 - local_568.begin.y) * local_568.jstride +
                                                 (~local_568.begin.x + iVar30) + lVar35]) * dVar5) *
                               dVar70 + axfab.p[lVar28 + (long)(~axfab.begin.x + iVar30) +
                                                         lVar34 + axfab.nstride * 2];
                        }
                        else if (uVar20 == 0) {
                          lVar28 = (lVar32 - fxfab.begin.y) * fxfab.jstride;
                          lVar34 = (lVar25 - fxfab.begin.z) * fxfab.kstride;
                          lVar26 = (long)(iVar30 - fxfab.begin.x);
                          lVar27 = (long)((iVar30 - fxfab.begin.x) + -1);
                          lVar35 = (long)(~fyfab.begin.x + iVar30);
                          lVar29 = ((iVar12 + 1) - fyfab.begin.y) * fyfab.jstride;
                          lVar46 = (lVar25 - fyfab.begin.z) * fyfab.kstride;
                          lVar39 = (iVar12 - fyfab.begin.y) * fyfab.jstride;
                          lVar40 = (long)(~fzfab.begin.x + iVar30);
                          lVar42 = (lVar32 - fzfab.begin.y) * fzfab.jstride;
                          lVar44 = (int)((uVar13 + 1) - fzfab.begin.z) * fzfab.kstride;
                          lVar45 = (int)(uVar13 - fzfab.begin.z) * fzfab.kstride;
                          lVar47 = (lVar32 - axfab.begin.y) * axfab.jstride;
                          lVar50 = (lVar25 - axfab.begin.z) * axfab.kstride;
                          lVar43 = (long)(~axfab.begin.x + iVar30);
                          axfab.p[lVar47 + lVar43 + lVar50] =
                               ((fzfab.p[lVar42 + lVar40 + lVar44] -
                                fzfab.p[lVar42 + lVar40 + lVar45]) * dVar6 +
                               (fxfab.p[lVar28 + lVar26 + lVar34] -
                               fxfab.p[lVar28 + lVar27 + lVar34]) * (double)CONCAT44(uVar80,uVar79)
                               + (fyfab.p[lVar29 + lVar35 + lVar46] -
                                 fyfab.p[lVar39 + lVar35 + lVar46]) * dVar5) * dVar7 +
                               axfab.p[lVar47 + lVar43 + lVar50];
                          axfab.p[lVar47 + lVar43 + lVar50 + axfab.nstride] =
                               ((fzfab.p[lVar42 + lVar40 + lVar44 + fzfab.nstride] -
                                fzfab.p[lVar42 + lVar40 + lVar45 + fzfab.nstride]) * dVar6 +
                               (fxfab.p[lVar28 + lVar26 + lVar34 + fxfab.nstride] -
                               fxfab.p[lVar28 + lVar27 + lVar34 + fxfab.nstride]) *
                               (double)CONCAT44(uVar80,uVar79) +
                               (fyfab.p[lVar29 + lVar35 + lVar46 + fyfab.nstride] -
                               fyfab.p[lVar39 + lVar35 + lVar46 + fyfab.nstride]) * dVar5) * dVar7 +
                               axfab.p[lVar47 + lVar43 + lVar50 + axfab.nstride];
                          axfab.p[lVar47 + lVar43 + lVar50 + axfab.nstride * 2] =
                               ((fzfab.p[lVar42 + lVar40 + lVar44 + fzfab.nstride * 2] -
                                fzfab.p[lVar42 + lVar40 + lVar45 + fzfab.nstride * 2]) * dVar6 +
                               (fxfab.p[lVar28 + lVar26 + lVar34 + fxfab.nstride * 2] -
                               fxfab.p[lVar28 + lVar27 + lVar34 + fxfab.nstride * 2]) *
                               (double)CONCAT44(uVar80,uVar79) +
                               (fyfab.p[lVar29 + lVar35 + lVar46 + fyfab.nstride * 2] -
                               fyfab.p[lVar39 + lVar35 + lVar46 + fyfab.nstride * 2]) * dVar5) *
                               dVar7 + axfab.p[lVar47 + lVar43 + lVar50 + axfab.nstride * 2];
                        }
                      } while (iVar30 - iVar16 != 1);
                    }
                    bVar53 = iVar12 != iVar17;
                    iVar12 = iVar12 + 1;
                  } while (bVar53);
                }
                bVar53 = uVar13 != iVar18;
                pFVar22 = local_4a8;
                uVar13 = uVar13 + 1;
              } while (bVar53);
            }
          }
        }
        MFIter::operator++(&mfi);
      } while (mfi.currentIndex < mfi.endIndex);
    }
    MFIter::~MFIter(&mfi);
  }
  return;
}

Assistant:

void
MLEBTensorOp::apply (int amrlev, int mglev, MultiFab& out, MultiFab& in, BCMode bc_mode,
                     StateMode s_mode, const MLMGBndry* bndry) const
{
    BL_PROFILE("MLEBTensorOp::apply()");
    MLEBABecLap::apply(amrlev, mglev, out, in, bc_mode, s_mode, bndry);

    if (mglev >= m_kappa[amrlev].size()) return;

    applyBCTensor(amrlev, mglev, in, bc_mode, s_mode, bndry);

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
    auto area = (factory) ? factory->getAreaFrac()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
    auto fcent = (factory) ? factory->getFaceCent()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
    const MultiCutFab* bcent = (factory) ? &(factory->getBndryCent()) : nullptr;

    const Geometry& geom = m_geom[amrlev][mglev];
    const auto dxinv = geom.InvCellSizeArray();

    Array<MultiFab,AMREX_SPACEDIM>& fluxmf = m_tauflux[amrlev][mglev];
    iMultiFab const& mask = m_cc_mask[amrlev][mglev];
    MultiFab const& etaebmf = *m_eb_b_coeffs[amrlev][mglev];
    MultiFab const& kapebmf = m_eb_kappa[amrlev][mglev];
    Real bscalar = m_b_scalar;

    compCrossTerms(amrlev, mglev, in);

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(out, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();

        auto fabtyp = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        if (fabtyp == FabType::covered) continue;

        Array4<Real> const axfab = out.array(mfi);
        AMREX_D_TERM(Array4<Real const> const fxfab = fluxmf[0].const_array(mfi);,
                     Array4<Real const> const fyfab = fluxmf[1].const_array(mfi);,
                     Array4<Real const> const fzfab = fluxmf[2].const_array(mfi););

        if (fabtyp == FabType::regular)
        {
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
            {
                mltensor_cross_terms(tbx, axfab, AMREX_D_DECL(fxfab,fyfab,fzfab), dxinv, bscalar);
            });
        }
        else
        {
            Array4<Real const> const& vfab = in.const_array(mfi);
            Array4<Real const> const& etab = etaebmf.const_array(mfi);
            Array4<Real const> const& kapb = kapebmf.const_array(mfi);
            Array4<int const> const& ccm = mask.const_array(mfi);
            Array4<EBCellFlag const> const& flag = flags->const_array(mfi);
            Array4<Real const> const& vol = vfrac->const_array(mfi);
            AMREX_D_TERM(Array4<Real const> const& apx = area[0]->const_array(mfi);,
                         Array4<Real const> const& apy = area[1]->const_array(mfi);,
                         Array4<Real const> const& apz = area[2]->const_array(mfi););
            AMREX_D_TERM(Array4<Real const> const& fcx = fcent[0]->const_array(mfi);,
                         Array4<Real const> const& fcy = fcent[1]->const_array(mfi);,
                         Array4<Real const> const& fcz = fcent[2]->const_array(mfi););
            Array4<Real const> const& bc = bcent->const_array(mfi);

            Array4<Real const> foo;
            const bool is_eb_dirichlet =  isEBDirichlet();
            const bool is_eb_inhomog = m_is_eb_inhomog;
            Array4<Real const> const& velbfab = (is_eb_dirichlet && is_eb_inhomog)
                ? m_eb_phi[amrlev]->const_array(mfi) : foo;

            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
            {
                mlebtensor_cross_terms(tbx, axfab,
                                       AMREX_D_DECL(fxfab,fyfab,fzfab),
                                       vfab, velbfab, etab, kapb, ccm, flag, vol,
                                       AMREX_D_DECL(apx,apy,apz),
                                       AMREX_D_DECL(fcx,fcy,fcz),
                                       bc, is_eb_dirichlet, is_eb_inhomog,
                                       dxinv, bscalar);
            });
        }
    }
}